

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

Primer * __thiscall ASDCP::MXF::Primer::WriteToFile(Primer *this,FileWriter *Writer)

{
  int iVar1;
  uint *puVar2;
  ui32_t in_EDX;
  Result_t local_130 [104];
  Result_t local_c8 [127];
  undefined1 local_49;
  undefined1 local_48 [8];
  FrameBuffer Buffer;
  FileWriter *Writer_local;
  Primer *this_local;
  Result_t *result;
  
  Buffer.m_SourceLength = in_EDX;
  FrameBuffer::FrameBuffer((FrameBuffer *)local_48);
  local_49 = 0;
  FrameBuffer::Capacity((FrameBuffer *)this,(ui32_t)(FrameBuffer *)local_48);
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar1) {
    (**(code **)(*(long *)Writer + 0x80))(local_c8,Writer,local_48);
    Kumu::Result_t::operator=((Result_t *)this,local_c8);
    Kumu::Result_t::~Result_t(local_c8);
  }
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar1) {
    puVar2 = (uint *)FrameBuffer::RoData((FrameBuffer *)local_48);
    FrameBuffer::Size((FrameBuffer *)local_48);
    Kumu::FileWriter::Write((uchar *)local_130,Buffer.m_SourceLength,puVar2);
    Kumu::Result_t::operator=((Result_t *)this,local_130);
    Kumu::Result_t::~Result_t(local_130);
  }
  local_49 = 1;
  FrameBuffer::~FrameBuffer((FrameBuffer *)local_48);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::Primer::WriteToFile(Kumu::FileWriter& Writer)
{
  ASDCP::FrameBuffer Buffer;
  Result_t result = Buffer.Capacity(128*1024);

  if ( ASDCP_SUCCESS(result) )
    result = WriteToBuffer(Buffer);

  if ( ASDCP_SUCCESS(result) )
  result = Writer.Write(Buffer.RoData(), Buffer.Size());

  return result;
}